

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::span
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint length_00;
  UnicodeString *pUVar5;
  char16_t *pcVar6;
  int local_b8;
  int32_t minOffset;
  int32_t inc_1;
  int32_t length16_1;
  UChar *s16_1;
  UnicodeString *string_1;
  int32_t overlap_1;
  int32_t maxOverlap;
  int32_t maxInc;
  int32_t inc;
  int32_t length16;
  UChar *s16;
  UnicodeString *string;
  int32_t overlap;
  int32_t stringsLength;
  int32_t i;
  int32_t rest;
  int32_t pos;
  undefined1 local_58 [8];
  OffsetList offsets;
  int32_t spanLength;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  UChar *s_local;
  UnicodeSetStringSpan *this_local;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    this_local._4_4_ = spanNot(this,s,length);
  }
  else {
    offsets._36_4_ = UnicodeSet::span(&this->spanSet,s,length,USET_SPAN_CONTAINED);
    this_local._4_4_ = length;
    if (offsets._36_4_ != length) {
      OffsetList::OffsetList((OffsetList *)local_58);
      if (spanCondition == USET_SPAN_CONTAINED) {
        OffsetList::setMaxLength((OffsetList *)local_58,this->maxLength16);
      }
      i = offsets._36_4_;
      stringsLength = length - offsets._36_4_;
      iVar3 = UVector::size(this->strings);
LAB_003960bc:
      while (spanCondition != USET_SPAN_CONTAINED) {
        overlap_1 = 0;
        string_1._4_4_ = 0;
        for (overlap = 0; overlap < iVar3; overlap = overlap + 1) {
          bVar1 = this->spanLengths[overlap];
          pUVar5 = (UnicodeString *)UVector::elementAt(this->strings,overlap);
          pcVar6 = UnicodeString::getBuffer(pUVar5);
          length_00 = UnicodeString::length(pUVar5);
          string_1._0_4_ = (uint)bVar1;
          if (0xfd < bVar1) {
            string_1._0_4_ = length_00;
          }
          if ((int)offsets._36_4_ < (int)(uint)string_1) {
            string_1._0_4_ = offsets._36_4_;
          }
          local_b8 = length_00 - (uint)string_1;
          while( true ) {
            if ((stringsLength < local_b8) || ((int)(uint)string_1 < (int)string_1._4_4_))
            goto LAB_0039643c;
            if ((((int)string_1._4_4_ < (int)(uint)string_1) || (overlap_1 < local_b8)) &&
               (UVar2 = matches16CPB(s,i - (uint)string_1,length,pcVar6,length_00), UVar2 != '\0'))
            break;
            string_1._0_4_ = (uint)string_1 - 1;
            local_b8 = local_b8 + 1;
          }
          overlap_1 = local_b8;
          string_1._4_4_ = (uint)string_1;
LAB_0039643c:
        }
        if ((overlap_1 == 0) && (string_1._4_4_ == 0)) goto LAB_003964a1;
        i = overlap_1 + i;
        stringsLength = stringsLength - overlap_1;
        if (stringsLength == 0) goto LAB_00396638;
        offsets._36_4_ = 0;
      }
      for (overlap = 0; overlap < iVar3; overlap = overlap + 1) {
        string._0_4_ = (uint)this->spanLengths[overlap];
        if ((uint)string != 0xff) {
          pUVar5 = (UnicodeString *)UVector::elementAt(this->strings,overlap);
          pcVar6 = UnicodeString::getBuffer(pUVar5);
          iVar4 = UnicodeString::length(pUVar5);
          if ((((0xfd < (uint)string) &&
               (string._0_4_ = iVar4 - 1, (pcVar6[(int)(uint)string] & 0xfc00U) == 0xdc00)) &&
              (0 < (int)(uint)string)) && ((pcVar6[iVar4 + -2] & 0xfc00U) == 0xd800)) {
            string._0_4_ = iVar4 - 2;
          }
          if ((int)offsets._36_4_ < (int)(uint)string) {
            string._0_4_ = offsets._36_4_;
          }
          for (maxInc = iVar4 - (uint)string; maxInc <= stringsLength; maxInc = maxInc + 1) {
            UVar2 = OffsetList::containsOffset((OffsetList *)local_58,maxInc);
            if ((UVar2 == '\0') &&
               (UVar2 = matches16CPB(s,i - (uint)string,length,pcVar6,iVar4), UVar2 != '\0')) {
              if (maxInc == stringsLength) goto LAB_00396638;
              OffsetList::addOffset((OffsetList *)local_58,maxInc);
            }
            if ((uint)string == 0) break;
            string._0_4_ = (uint)string - 1;
          }
        }
      }
LAB_003964a1:
      if ((offsets._36_4_ == 0) && (i != 0)) {
        UVar2 = OffsetList::isEmpty((OffsetList *)local_58);
        if (UVar2 != '\0') {
          offsets._36_4_ = UnicodeSet::span(&this->spanSet,s + i,stringsLength,USET_SPAN_CONTAINED);
          if ((offsets._36_4_ == stringsLength) || (offsets._36_4_ == 0)) {
            this_local._4_4_ = i + offsets._36_4_;
LAB_00396638:
            OffsetList::~OffsetList((OffsetList *)local_58);
            return this_local._4_4_;
          }
          i = offsets._36_4_ + i;
          stringsLength = stringsLength - offsets._36_4_;
          goto LAB_003960bc;
        }
        offsets._36_4_ = spanOne(&this->spanSet,s + i,stringsLength);
        if (0 < (int)offsets._36_4_) {
          if (offsets._36_4_ == stringsLength) goto LAB_00396638;
          i = i + offsets._36_4_;
          stringsLength = stringsLength - offsets._36_4_;
          OffsetList::shift((OffsetList *)local_58,offsets._36_4_);
          offsets._36_4_ = 0;
          goto LAB_003960bc;
        }
      }
      else {
        UVar2 = OffsetList::isEmpty((OffsetList *)local_58);
        if (UVar2 != '\0') {
          this_local._4_4_ = i;
          goto LAB_00396638;
        }
      }
      iVar4 = OffsetList::popMinimum((OffsetList *)local_58);
      i = iVar4 + i;
      stringsLength = stringsLength - iVar4;
      offsets._36_4_ = 0;
      goto LAB_003960bc;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSetStringSpan::span(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNot(s, length);
    }
    int32_t spanLength=spanSet.span(s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    U16_BACK_1(s16, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    if(!offsets.containsOffset(inc) && matches16CPB(s, pos-overlap, length, s16, length16)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                        matches16CPB(s, pos-overlap, length, s16, length16)
                    ) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.span(s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOne(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}